

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O3

void __thiscall
duckdb::PartitionedTupleData::BuildPartitionSel
          (PartitionedTupleData *this,PartitionedTupleDataAppendState *state,
          SelectionVector *append_sel,idx_t append_count)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->_vptr_PartitionedTupleData[5])();
  if (CONCAT44(extraout_var,iVar1) < 0x100) {
    BuildPartitionSel<true>(state,append_sel,append_count);
    return;
  }
  BuildPartitionSel<false>(state,append_sel,append_count);
  return;
}

Assistant:

void PartitionedTupleData::BuildPartitionSel(PartitionedTupleDataAppendState &state, const SelectionVector &append_sel,
                                             const idx_t append_count) const {
	if (UseFixedSizeMap()) {
		BuildPartitionSel<true>(state, append_sel, append_count);
	} else {
		BuildPartitionSel<false>(state, append_sel, append_count);
	}
}